

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_smother(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  int iVar2;
  AFFECT_DATA af;
  
  act("$N chokes and gasps for air as you smother $M with thick smoke!",ch,(void *)0x0,vo,3);
  act("You choke and gasp for air as $n smothers you with thick smoke!",ch,(void *)0x0,vo,2);
  act("$N chokes and gasps for air as $n smothers $M with thick smoke!",ch,(void *)0x0,vo,1);
  iVar1 = number_percent();
  iVar2 = get_curr_stat((CHAR_DATA *)vo,4);
  if (iVar2 * 6 + -0x48 < iVar1) {
    init_affect(&af);
    af.where = 0;
    af.aftype = 3;
    af.type = (short)sn;
    af.duration = 1;
    af.location = 0;
    af.modifier = 0;
    af.mod_name = 0;
    af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
    af.owner = ch;
    af.level = (short)level;
    affect_to_char((CHAR_DATA *)vo,&af);
  }
  LAG_CHAR((CHAR_DATA *)vo,0xc);
  return;
}

Assistant:

void spell_smother(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	act("$N chokes and gasps for air as you smother $M with thick smoke!", ch, 0, victim, TO_CHAR);
	act("You choke and gasp for air as $n smothers you with thick smoke!", ch, 0, victim, TO_VICT);
	act("$N chokes and gasps for air as $n smothers $M with thick smoke!", ch, 0, victim, TO_NOTVICT);

	if (number_percent() > 6 * (get_curr_stat(victim, STAT_CON) - 12))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = 0;
		af.duration = 1;
		af.level = level;
		af.modifier = 0;

		SET_BIT(af.bitvector, AFF_BLIND);

		af.mod_name = MOD_VISION;
		af.owner = ch;
		affect_to_char(victim, &af);
	}

	LAG_CHAR(victim, PULSE_VIOLENCE);
}